

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O3

ArrayXZ * __thiscall IMLE::getMultiplePredictionErrorReductionDerivative(IMLE *this)

{
  XZ *other;
  double *pdVar1;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pPVar2;
  DenseStorage<double,__1,__1,__1,_0> *pDVar3;
  double *pdVar4;
  double *pdVar5;
  int iVar6;
  pointer pMVar7;
  pointer pMVar8;
  pointer pMVar9;
  pointer pMVar10;
  pointer pFVar11;
  double *pdVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Scal SVar15;
  double dVar16;
  double dVar17;
  undefined8 *puVar18;
  Index index_3;
  long lVar19;
  Index index;
  ulong uVar20;
  ulong uVar21;
  Index index_2;
  ulong uVar22;
  pointer pMVar23;
  pointer pMVar24;
  ActualDstType actualDst_2;
  long lVar25;
  double dVar26;
  long lVar27;
  X invRjSqPsij;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  ArrayX sumInvRjSqPsijGammaj;
  ArrayXZ sumInvRjSqPsijGammajZetaj;
  ArrayXZ sumInvRjSqPsijDelta_dGammaj;
  assign_op<double,_double> local_169;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_168;
  long local_150;
  double local_148;
  DstEvaluatorType local_140;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_1>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
  local_130;
  undefined1 local_110 [8];
  undefined1 local_108 [24];
  Mat *pMStack_f0;
  double *local_e8;
  scalar_constant_op<double> local_e0;
  long lStack_d8;
  double *local_d0;
  Index IStack_c8;
  Mat *local_c0;
  Z *local_b8;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_b0;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_98;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_80;
  double local_68;
  undefined8 uStack_60;
  DenseStorage<double,__1,__1,_1,_0> local_58;
  DenseStorage<double,__1,__1,__1,_0> local_48;
  
  if (this->hasPredErrorReductionDrvt == false) {
    if (this->hasPredJacobian == false) {
      getMultiplePredictionsJacobian(this);
    }
    pMVar7 = (this->predictionsErrorReduction).
             super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pMVar8 = (this->predictionsErrorReduction).
             super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pMVar23 = pMVar7;
    if (pMVar8 != pMVar7) {
      do {
        free((pMVar23->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data);
        pMVar23 = pMVar23 + 1;
      } while (pMVar23 != pMVar8);
      (this->predictionsErrorReduction).
      super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pMVar7;
    }
    pMVar9 = (this->predictionsErrorReductionJacobian).
             super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pMVar10 = (this->predictionsErrorReductionJacobian).
              super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pMVar24 = pMVar9;
    if (pMVar10 != pMVar9) {
      do {
        free((pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data);
        pMVar24 = pMVar24 + 1;
      } while (pMVar24 != pMVar10);
      (this->predictionsErrorReductionJacobian).
      super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pMVar9;
    }
    iVar6 = this->nSolFound;
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              (&local_58,(DenseStorage<double,__1,__1,_1,_0> *)&this->zeroX);
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::resize(&this->predictionsErrorReduction,(long)iVar6,(value_type *)&local_58);
    free(local_58.m_data);
    iVar6 = this->nSolFound;
    other = &this->zeroXZ;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
              (&local_48,(DenseStorage<double,__1,__1,__1,_0> *)other);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::resize(&this->predictionsErrorReductionJacobian,(long)iVar6,(value_type *)&local_48);
    free(local_48.m_data);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::vector(&local_80,(long)this->nSolFound,other,(allocator_type *)local_110);
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::vector(&local_b0,(long)this->nSolFound,&this->zeroX,(allocator_type *)local_110);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::vector(&local_98,(long)this->nSolFound,other,(allocator_type *)local_110);
    if (this->M < 1) {
      local_168.m_storage.m_data = (double *)0x0;
      local_168.m_storage.m_rows = 0;
    }
    else {
      local_148 = 0.0;
      lVar25 = 0x168;
      lVar27 = 0;
      do {
        pFVar11 = (this->experts).
                  super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                  .
                  super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        SVar15 = LinearExpert::queryHafterZ
                           ((LinearExpert *)((long)pFVar11 + lVar25 + -0x168),
                            (X *)((long)&(pFVar11->super_LinearExpert).d + lVar25));
        local_148 = local_148 + SVar15;
        lVar27 = lVar27 + 1;
        lVar25 = lVar25 + 0x308;
      } while (lVar27 < this->M);
      local_168.m_storage.m_data = (double *)0x0;
      local_168.m_storage.m_rows = 0;
      if (0 < this->M) {
        local_b8 = &this->zQuery;
        local_c0 = &this->zeta;
        local_150 = 0;
        dVar26 = 0.0;
        do {
          pFVar11 = (this->experts).
                    super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                    .
                    super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          FastLinearExpert::queryNewPredXVar
                    (pFVar11 + (long)dVar26,local_b8,
                     pFVar11[(long)dVar26].super_LinearExpert.h / local_148);
          pdVar12 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data;
          local_68 = (this->experts).
                     super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                     .
                     super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)dVar26].super_LinearExpert.
                     p_z_T / (this->varPhiAuxj).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data[(long)dVar26];
          uStack_60 = 0;
          uVar21 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
          uVar22 = uVar21;
          if (local_168.m_storage.m_rows != uVar21) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&local_168,uVar21,1);
            uVar22 = local_168.m_storage.m_rows;
          }
          uVar20 = uVar22 - ((long)uVar22 >> 0x3f) & 0xfffffffffffffffe;
          if (1 < (long)uVar22) {
            lVar25 = 0;
            do {
              pdVar1 = (double *)((long)pdVar12 + lVar25 * 8 + uVar21 * local_150);
              dVar16 = pdVar1[1];
              local_168.m_storage.m_data[lVar25] = *pdVar1 * local_68;
              (local_168.m_storage.m_data + lVar25)[1] = dVar16 * local_68;
              lVar25 = lVar25 + 2;
            } while (lVar25 < (long)uVar20);
          }
          if ((long)uVar20 < (long)uVar22) {
            do {
              local_168.m_storage.m_data[uVar20] =
                   *(double *)((long)pdVar12 + uVar20 * 8 + uVar21 * local_150) * local_68;
              uVar20 = uVar20 + 1;
            } while (uVar22 != uVar20);
          }
          pFVar11 = (this->experts).
                    super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                    .
                    super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_108._0_8_ = &pFVar11[(long)dVar26].super_LinearExpert.dGamma;
          local_108._8_8_ = &pFVar11[(long)dVar26].super_LinearExpert.dNewGamma;
          local_110 = (undefined1  [8])&local_168;
          Eigen::internal::
          outer_product_selector_run<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>,Eigen::internal::generic_product_impl<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>,Eigen::DenseShape,Eigen::DenseShape,5>::add>
                    (local_80.
                     super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
                     (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)dVar26],
                     (Matrix<double,__1,_1,_0,__1,_1> *)local_110,
                     (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)(local_110 + 8),(add *)&local_130,(false_type *)&local_140);
          pFVar11 = (this->experts).
                    super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                    .
                    super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          dVar16 = pFVar11[(long)dVar26].super_LinearExpert.gamma -
                   pFVar11[(long)dVar26].super_LinearExpert.newGamma;
          uVar21 = local_168.m_storage.m_rows - (local_168.m_storage.m_rows >> 0x3f) &
                   0xfffffffffffffffe;
          if (1 < local_168.m_storage.m_rows) {
            lVar25 = 0;
            do {
              dVar17 = (local_168.m_storage.m_data + lVar25)[1];
              local_168.m_storage.m_data[lVar25] = local_168.m_storage.m_data[lVar25] * dVar16;
              (local_168.m_storage.m_data + lVar25)[1] = dVar17 * dVar16;
              lVar25 = lVar25 + 2;
            } while (lVar25 < (long)uVar21);
          }
          if ((long)uVar21 < local_168.m_storage.m_rows) {
            do {
              local_168.m_storage.m_data[uVar21] = local_168.m_storage.m_data[uVar21] * dVar16;
              uVar21 = uVar21 + 1;
            } while (local_168.m_storage.m_rows != uVar21);
          }
          iVar6 = (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)dVar26];
          pdVar12 = local_b0.
                    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar6].
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
          uVar21 = local_b0.
                   super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar6].
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
          uVar22 = uVar21 - ((long)uVar21 >> 0x3f) & 0xfffffffffffffffe;
          if (1 < (long)uVar21) {
            lVar25 = 0;
            do {
              dVar16 = (local_168.m_storage.m_data + lVar25)[1] + (pdVar12 + lVar25)[1];
              auVar13._8_4_ = SUB84(dVar16,0);
              auVar13._0_8_ = local_168.m_storage.m_data[lVar25] + pdVar12[lVar25];
              auVar13._12_4_ = (int)((ulong)dVar16 >> 0x20);
              *(undefined1 (*) [16])(pdVar12 + lVar25) = auVar13;
              lVar25 = lVar25 + 2;
            } while (lVar25 < (long)uVar22);
          }
          if ((long)uVar22 < (long)uVar21) {
            do {
              pdVar12[uVar22] = local_168.m_storage.m_data[uVar22] + pdVar12[uVar22];
              uVar22 = uVar22 + 1;
            } while (uVar21 != uVar22);
          }
          local_108._8_8_ =
               (this->zeta).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
          local_108._0_8_ =
               (this->zeta).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data + local_108._8_8_ * (long)dVar26;
          local_110 = (undefined1  [8])&local_168;
          pMStack_f0 = local_c0;
          local_e8 = (double *)0x0;
          local_e0.m_other = dVar26;
          lStack_d8 = local_108._8_8_;
          Eigen::internal::
          outer_product_selector_run<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>,Eigen::internal::generic_product_impl<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>,Eigen::DenseShape,Eigen::DenseShape,5>::add>
                    (local_98.
                     super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
                     (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)dVar26],
                     (Matrix<double,__1,_1,_0,__1,_1> *)local_110,
                     (Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                      *)(local_110 + 8),(add *)&local_130,(false_type *)&local_140);
          dVar26 = (double)((long)dVar26 + 1);
          local_150 = local_150 + 8;
        } while ((long)dVar26 < (long)this->M);
      }
    }
    if (0 < this->nSolFound) {
      lVar25 = 0;
      do {
        dVar26 = (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data[lVar25];
        if ((dVar26 != 0.0) || (NAN(dVar26))) {
          pMVar7 = (this->predictionsErrorReduction).
                   super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pPVar2 = &pMVar7[lVar25].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
          lVar27 = (long)(this->predictionsVar).
                         super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar25].
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data;
          pdVar12 = local_b0.
                    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar25].
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
          uVar21 = local_b0.
                   super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar25].
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
          if (pMVar7[lVar25].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows != uVar21) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(pPVar2,uVar21,1)
            ;
            uVar21 = (pPVar2->m_storage).m_rows;
          }
          pdVar1 = (pPVar2->m_storage).m_data;
          uVar22 = uVar21 - ((long)uVar21 >> 0x3f) & 0xfffffffffffffffe;
          if (1 < (long)uVar21) {
            lVar19 = 0;
            do {
              pdVar5 = (double *)(lVar27 + lVar19 * 8);
              dVar16 = *pdVar5;
              dVar26 = pdVar5[1];
              pdVar5 = pdVar12 + lVar19;
              dVar26 = dVar26 * dVar26 * pdVar5[1];
              auVar14._8_4_ = SUB84(dVar26,0);
              auVar14._0_8_ = dVar16 * dVar16 * *pdVar5;
              auVar14._12_4_ = (int)((ulong)dVar26 >> 0x20);
              *(undefined1 (*) [16])(pdVar1 + lVar19) = auVar14;
              lVar19 = lVar19 + 2;
            } while (lVar19 < (long)uVar22);
          }
          if ((long)uVar22 < (long)uVar21) {
            do {
              dVar26 = *(double *)(lVar27 + uVar22 * 8);
              pdVar1[uVar22] = dVar26 * dVar26 * pdVar12[uVar22];
              uVar22 = uVar22 + 1;
            } while (uVar21 != uVar22);
          }
          pMVar9 = (this->predictionsVarJacobian).
                   super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pMVar10 = (this->predictionsErrorReductionJacobian).
                    super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pDVar3 = (DenseStorage<double,__1,__1,__1,_0> *)(pMVar10 + lVar25);
          local_108._0_8_ = (double *)0x4000000000000000;
          pMStack_f0 = (Mat *)(this->predictionsVar).
                              super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar25].
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data;
          local_e8 = local_b0.
                     super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar25].
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          ;
          local_e0.m_other =
               (double)pMVar9[lVar25].
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_data;
          lStack_d8 = pMVar9[lVar25].
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_rows;
          lVar27 = local_b0.
                   super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar25].
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
          lVar19 = pMVar9[lVar25].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols;
          if ((pMVar10[lVar25].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows != lVar27) ||
             (pMVar10[lVar25].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols != lVar19)) {
            if ((lVar27 != 0) &&
               ((lVar19 != 0 &&
                (auVar13 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
                SUB168(auVar13 / SEXT816(lVar19),0) < lVar27)))) {
              puVar18 = (undefined8 *)
                        __cxa_allocate_exception(8,pMVar9,SUB168(auVar13 % SEXT816(lVar19),0));
              *puVar18 = operator_delete;
              __cxa_throw(puVar18,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(pDVar3,lVar19 * lVar27,lVar27,lVar19)
            ;
            lVar27 = pDVar3->m_rows;
          }
          local_140.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
          data = pDVar3->m_data;
          local_130.m_dst = &local_140;
          local_130.m_src = (SrcEvaluatorType *)local_110;
          local_130.m_functor = (add_assign_op<double,_double> *)&local_169;
          local_140.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
          m_outerStride = lVar27;
          local_130.m_dstExpr = (DstXprType *)pDVar3;
          Eigen::internal::
          dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
          ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
                 *)&local_130);
          pMVar9 = (this->predictionsErrorReductionJacobian).
                   super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_130.m_dstExpr = pMVar9 + lVar25;
          local_108._0_8_ =
               (this->predictionsVar).
               super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar25].
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
          local_108._16_8_ =
               local_80.
               super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar25].
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
          pMStack_f0 = (Mat *)local_80.
                              super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar25].
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_rows;
          local_e0.m_other = 2.0;
          local_d0 = local_98.
                     super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar25].
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_data;
          IStack_c8 = local_98.
                      super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar25].
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_rows;
          pMVar9 = pMVar9 + lVar25;
          local_140.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
          data = (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_data;
          local_140.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
          m_outerStride =
               (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_rows;
          local_130.m_dst = &local_140;
          local_130.m_src = (SrcEvaluatorType *)local_110;
          local_130.m_functor = (add_assign_op<double,_double> *)&local_169;
          Eigen::internal::
          dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_1>_>,_Eigen::internal::add_assign_op<double,_double>,_0>,_4,_0>
          ::run(&local_130);
        }
        else {
          pMVar7 = (this->predictionsErrorReduction).
                   super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar12 = (this->zeroX).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data;
          pPVar2 = &pMVar7[lVar25].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
          uVar21 = (this->zeroX).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows;
          if (pMVar7[lVar25].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows != uVar21) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(pPVar2,uVar21,1)
            ;
            uVar21 = (pPVar2->m_storage).m_rows;
          }
          pdVar1 = (pPVar2->m_storage).m_data;
          uVar22 = uVar21 - ((long)uVar21 >> 0x3f) & 0xfffffffffffffffe;
          if (1 < (long)uVar21) {
            lVar27 = 0;
            do {
              pdVar5 = pdVar12 + lVar27;
              dVar26 = pdVar5[1];
              pdVar4 = pdVar1 + lVar27;
              *pdVar4 = *pdVar5;
              pdVar4[1] = dVar26;
              lVar27 = lVar27 + 2;
            } while (lVar27 < (long)uVar22);
          }
          if ((long)uVar22 < (long)uVar21) {
            do {
              pdVar1[uVar22] = pdVar12[uVar22];
              uVar22 = uVar22 + 1;
            } while (uVar21 != uVar22);
          }
          pMVar9 = (this->predictionsErrorReductionJacobian).
                   super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar12 = (this->zeroXZ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data;
          pDVar3 = (DenseStorage<double,__1,__1,__1,_0> *)(pMVar9 + lVar25);
          lVar27 = (this->zeroXZ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
          lVar19 = (this->zeroXZ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols;
          if ((pDVar3->m_rows != lVar27) ||
             (pMVar9[lVar25].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols != lVar19)) {
            if ((lVar19 != 0 && lVar27 != 0) &&
               (auVar13 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
               SUB168(auVar13 / SEXT816(lVar19),0) < lVar27)) {
              puVar18 = (undefined8 *)
                        __cxa_allocate_exception(8,uVar21,SUB168(auVar13 % SEXT816(lVar19),0));
              *puVar18 = operator_delete;
              __cxa_throw(puVar18,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(pDVar3,lVar19 * lVar27,lVar27,lVar19)
            ;
            lVar27 = pDVar3->m_rows;
            lVar19 = pDVar3->m_cols;
          }
          lVar19 = lVar19 * lVar27;
          pdVar1 = pDVar3->m_data;
          uVar21 = lVar19 - (lVar19 >> 0x3f) & 0xfffffffffffffffe;
          if (1 < lVar19) {
            lVar27 = 0;
            do {
              pdVar5 = pdVar12 + lVar27;
              dVar26 = pdVar5[1];
              pdVar4 = pdVar1 + lVar27;
              *pdVar4 = *pdVar5;
              pdVar4[1] = dVar26;
              lVar27 = lVar27 + 2;
            } while (lVar27 < (long)uVar21);
          }
          if ((long)uVar21 < lVar19) {
            do {
              pdVar1[uVar21] = pdVar12[uVar21];
              uVar21 = uVar21 + 1;
            } while (lVar19 - uVar21 != 0);
          }
        }
        lVar25 = lVar25 + 1;
      } while (lVar25 < this->nSolFound);
    }
    this->hasPredErrorReductionDrvt = true;
    free(local_168.m_storage.m_data);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::~vector(&local_98);
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::~vector(&local_b0);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::~vector(&local_80);
  }
  return &this->predictionsErrorReductionJacobian;
}

Assistant:

IMLE_CLASS_TEMPLATE
IMLE_TYPENAME IMLE_base::ArrayXZ const &IMLE_base::getMultiplePredictionErrorReductionDerivative()
{
    if( !hasPredErrorReductionDrvt )
    {
        if( !hasPredJacobian )
            getMultiplePredictionsJacobian();

        predictionsErrorReduction.clear();
        predictionsErrorReductionJacobian.clear();
        predictionsErrorReduction.resize(nSolFound, zeroX);
        predictionsErrorReductionJacobian.resize(nSolFound, zeroXZ);

        ArrayXZ sumInvRjSqPsijDelta_dGammaj(nSolFound, zeroXZ);
        ArrayX sumInvRjSqPsijGammaj(nSolFound, zeroX);
        ArrayXZ sumInvRjSqPsijGammajZetaj(nSolFound, zeroXZ);

        Scal sumH = 0.0;
        for(int j = 0; j < M; j++)
            sumH += experts[j].queryHafterZ( experts[j].getPredX() );

        X invRjSqPsij;
        for(int j = 0; j < M; j++)
        {
            experts[j].queryNewPredXVar( zQuery, experts[j].get_h() / sumH );

            invRjSqPsij = fInvRj.col(j) * (experts[j].get_p_z() / varPhiAuxj(j));
            sumInvRjSqPsijDelta_dGammaj[sNearest[j]].noalias() += invRjSqPsij * ( experts[j].get_dGamma() - experts[j].get_dNewGamma() ).transpose();

            invRjSqPsij *= ( experts[j].getGamma() - experts[j].getNewGamma() ); //Using the same variable just to save resources...
            sumInvRjSqPsijGammaj[sNearest[j]] += invRjSqPsij;
            sumInvRjSqPsijGammajZetaj[sNearest[j]].noalias() += invRjSqPsij * zeta.col(j).transpose();
        }

       for( int k = 0; k < nSolFound; k++ )
            if(sum_p_z(k) == 0.0)  // Not likely, but...
            {
                predictionsErrorReduction[k] = zeroX;
                predictionsErrorReductionJacobian[k] = zeroXZ;
            }
            else
            {
                predictionsErrorReduction[k].noalias() = (predictionsVar[k].cwiseAbs2()).cwiseProduct(sumInvRjSqPsijGammaj[k]);
                predictionsErrorReductionJacobian[k].noalias() = (2.0*predictionsVar[k].cwiseProduct(sumInvRjSqPsijGammaj[k])).asDiagonal() * predictionsVarJacobian[k];
                predictionsErrorReductionJacobian[k].noalias() += predictionsVar[k].cwiseAbs2().asDiagonal() * (sumInvRjSqPsijDelta_dGammaj[k] - 2.0*sumInvRjSqPsijGammajZetaj[k]);
            }

        hasPredErrorReductionDrvt = true;
    }

    return predictionsErrorReductionJacobian;
}